

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choice.c
# Opt level: O2

void choice_list(t_choice *x,t_symbol *s,int argc,t_atom *argv)

{
  uint uVar1;
  t_elem_conflict *ptVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  t_float tVar8;
  double dVar9;
  float fVar10;
  float fVar11;
  t_float invec [10];
  
  for (lVar6 = 0; lVar6 != 10; lVar6 = lVar6 + 1) {
    tVar8 = atom_getfloatarg((int)lVar6,argc,argv);
    invec[lVar6] = tVar8;
  }
  uVar5 = 0xffffffffffffffff;
  fVar10 = 0.0;
  lVar6 = 4;
  for (uVar7 = 0; uVar1 = x->x_n, (long)uVar7 < (long)(int)uVar1; uVar7 = uVar7 + 1) {
    fVar11 = 0.0;
    for (lVar4 = 0; lVar4 != 10; lVar4 = lVar4 + 1) {
      fVar11 = fVar11 + *(float *)((long)x->x_vec->e_weight + lVar4 * 4 + lVar6 + -4) * invec[lVar4]
      ;
    }
    if (x->x_nonrepeat != 0) {
      dVar9 = log((double)x->x_vec[uVar7].e_age);
      fVar11 = fVar11 * (float)dVar9;
    }
    if (fVar10 < fVar11) {
      uVar5 = uVar7;
    }
    uVar5 = uVar5 & 0xffffffff;
    if (fVar11 <= fVar10) {
      fVar11 = fVar10;
    }
    fVar10 = fVar11;
    lVar6 = lVar6 + 0x2c;
  }
  if (-1 < (int)uVar5) {
    uVar3 = 0;
    uVar7 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar7 = uVar3;
    }
    ptVar2 = x->x_vec;
    for (; uVar7 * 0x2c - uVar3 != 0; uVar3 = uVar3 + 0x2c) {
      *(float *)((long)ptVar2->e_weight + (uVar3 - 4)) =
           *(float *)((long)ptVar2->e_weight + (uVar3 - 4)) + 1.0;
    }
    ptVar2[uVar5 & 0xffffffff].e_age = 1.0;
  }
  outlet_float((x->x_obj).te_outlet,(float)(int)uVar5);
  return;
}

Assistant:

static void choice_list(t_choice *x, t_symbol *s, int argc, t_atom *argv)
{
    int i, j;
    t_float bestsum = 0;
    int bestindex = -1;
    t_float invec[DIMENSION];
    for (i = 0; i < DIMENSION; i++)
        invec[i] = atom_getfloatarg(i, argc, argv);
    for (j = 0; j < x->x_n; j++)
    {
        t_elem *e = x->x_vec + j;
        t_float sum;
        for (i = 0, sum = 0; i < DIMENSION; i++)
            sum += e->e_weight[i] * invec[i];
        if (x->x_nonrepeat) sum *= (t_float)(log(e->e_age));
        if (sum > bestsum)
        {
            bestsum = sum;
            sum = 1;
            bestindex = j;
        }
    }
    if (bestindex >= 0)
    {
        for (j = 0; j < x->x_n; j++)
            x->x_vec[j].e_age += 1.;
        x->x_vec[bestindex].e_age = 1;
    }
    outlet_float(x->x_obj.ob_outlet, (t_float)bestindex);
}